

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image.hpp
# Opt level: O1

ImageT<unsigned_short,_2U> * __thiscall
ImageT<unsigned_short,_2U>::transformColorSpace
          (ImageT<unsigned_short,_2U> *this,TransferFunction *decode,TransferFunction *encode,
          ColorPrimaryTransform *transformPrimaries)

{
  Color *pCVar1;
  uint uVar2;
  uint uVar3;
  float (*pafVar4) [3];
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  undefined4 extraout_XMM0_Da;
  float fVar9;
  float extraout_XMM0_Da_00;
  float fVar10;
  float intensity [3];
  undefined8 local_70;
  undefined4 local_68;
  ImageT<unsigned_short,_2U> *local_60;
  float (*local_58) [3];
  ulong local_50;
  ulong local_48;
  undefined8 local_40;
  undefined4 local_38;
  
  uVar2 = (this->super_Image).height * (this->super_Image).width;
  local_60 = this;
  if (uVar2 != 0) {
    local_50 = (ulong)uVar2;
    uVar5 = 0;
    local_58 = (float (*) [3])transformPrimaries;
    do {
      pCVar1 = local_60->pixels;
      local_48 = uVar5;
      uVar3 = (*(local_60->super_Image)._vptr_Image[5])();
      uVar2 = 3;
      if (uVar3 < 3) {
        uVar2 = uVar3;
      }
      uVar8 = (ulong)uVar2;
      if (uVar3 != 0) {
        uVar7 = 0;
        do {
          (*decode->_vptr_TransferFunction[1])
                    ((ulong)(uint)((float)pCVar1[uVar5].field_0.comps[uVar7 != 0] * 1.5259022e-05),
                     decode);
          *(undefined4 *)((long)&local_70 + uVar7 * 4) = extraout_XMM0_Da;
          uVar7 = uVar7 + 1;
        } while (uVar8 != uVar7);
      }
      if (local_58 != (float (*) [3])0x0) {
        local_40 = local_70;
        local_38 = local_68;
        if (uVar3 != 0) {
          uVar7 = 0;
          pafVar4 = local_58;
          do {
            *(undefined4 *)((long)&local_70 + uVar7 * 4) = 0;
            fVar9 = 0.0;
            uVar6 = 0;
            do {
              fVar9 = fVar9 + (*(float (*) [3])*pafVar4)[uVar6] *
                              *(float *)((long)&local_40 + uVar6 * 4);
              uVar6 = uVar6 + 1;
            } while (uVar8 != uVar6);
            *(float *)((long)&local_70 + uVar7 * 4) = fVar9;
            uVar7 = uVar7 + 1;
            pafVar4 = pafVar4 + 1;
          } while (uVar7 != uVar8);
        }
      }
      if (uVar3 != 0) {
        uVar7 = 0;
        do {
          (**encode->_vptr_TransferFunction)((ulong)*(uint *)((long)&local_70 + uVar7 * 4),encode);
          fVar10 = roundf(extraout_XMM0_Da_00 * 65535.0);
          fVar9 = 65535.0;
          if (fVar10 <= 65535.0) {
            fVar9 = fVar10;
          }
          pCVar1[uVar5].field_0.comps[uVar7 != 0] =
               (unsigned_short)(int)(float)(~-(uint)(fVar10 < 0.0) & (uint)fVar9);
          uVar7 = uVar7 + 1;
        } while (uVar8 != uVar7);
      }
      uVar5 = local_48 + 1;
    } while (uVar5 != local_50);
  }
  return local_60;
}

Assistant:

virtual ImageT& transformColorSpace(const TransferFunction& decode, const TransferFunction& encode,
                                        const ColorPrimaryTransform* transformPrimaries) override {
        uint32_t pixelCount = getPixelCount();
        for (uint32_t i = 0; i < pixelCount; ++i) {
            Color& c = pixels[i];
            // Don't transform the alpha component.
            uint32_t components = cclamp(getComponentCount(), 0u, 3u);
            float intensity[3];
            float brightness[3];

            // Decode source transfer function
            for (uint32_t comp = 0; comp < components; comp++) {
                brightness[comp] = (float)(c[comp]) * Color::rcpOne();
                intensity[comp] = decode.decode(brightness[comp]);
            }

            // If needed, transform primaries
            if (transformPrimaries != nullptr) {
                float origIntensity[3] = { intensity[0], intensity[1], intensity[2] };
                for (uint32_t j = 0; j < components; ++j) {
                    intensity[j] = 0.f;
                    for (uint32_t k = 0; k < components; ++k)
                        intensity[j] += transformPrimaries->matrix[j][k] * origIntensity[k];
                }
            }

            // Encode destination transfer function
            for (uint32_t comp = 0; comp < components; comp++) {
                brightness[comp] = encode.encode(intensity[comp]);
                // clamp(value, color::min, color::max) is required as static_cast has platform-specific behaviors
                // and on certain platforms can over or underflow
                c.set(comp, cclamp(
                        roundf(brightness[comp] * static_cast<float>(Color::one())),
                        static_cast<float>(Color::min()),
                        static_cast<float>(Color::max())));
            }
        }
        return *this;
    }